

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest50
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  bool bVar1;
  Header *header;
  OrderQty local_3a0;
  allocator<char> local_341;
  string local_340;
  Price local_320;
  allocator<char> local_2c1;
  string local_2c0;
  Symbol local_2a0;
  CHAR local_241;
  HandlInst local_240;
  OrdType local_1e8;
  TransactTime local_190;
  Side local_138;
  ClOrdID local_d0;
  OrigClOrdID local_78;
  undefined1 local_19;
  Application *local_18;
  Application *this_local;
  OrderCancelReplaceRequest *cancelReplaceRequest;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Application *)__return_storage_ptr__;
  queryOrigClOrdID(&local_78,this);
  queryClOrdID(&local_d0,this);
  querySide(&local_138,this);
  FIX::TransactTime::TransactTime(&local_190);
  queryOrdType(&local_1e8,this);
  FIX50::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,&local_78,&local_d0,&local_138,&local_190,&local_1e8);
  FIX::OrdType::~OrdType(&local_1e8);
  FIX::TransactTime::~TransactTime(&local_190);
  FIX::Side::~Side(&local_138);
  FIX::ClOrdID::~ClOrdID(&local_d0);
  FIX::OrigClOrdID::~OrigClOrdID(&local_78);
  local_241 = '1';
  FIX::HandlInst::HandlInst(&local_240,&local_241);
  FIX50::OrderCancelReplaceRequest::set(__return_storage_ptr__,&local_240);
  FIX::HandlInst::~HandlInst(&local_240);
  querySymbol(&local_2a0,this);
  FIX50::OrderCancelReplaceRequest::set(__return_storage_ptr__,&local_2a0);
  FIX::Symbol::~Symbol(&local_2a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"New price",&local_2c1);
  bVar1 = queryConfirm(this,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  if (bVar1) {
    queryPrice(&local_320,this);
    FIX50::OrderCancelReplaceRequest::set(__return_storage_ptr__,&local_320);
    FIX::Price::~Price(&local_320);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"New quantity",&local_341)
  ;
  bVar1 = queryConfirm(this,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  if (bVar1) {
    queryOrderQty(&local_3a0,this);
    FIX50::OrderCancelReplaceRequest::set(__return_storage_ptr__,&local_3a0);
    FIX::OrderQty::~OrderQty(&local_3a0);
  }
  header = FIX50::Message::getHeader(&__return_storage_ptr__->super_Message);
  queryHeader(this,(Header *)header);
  return __return_storage_ptr__;
}

Assistant:

FIX50::OrderCancelReplaceRequest Application::queryCancelReplaceRequest50() {
  FIX50::OrderCancelReplaceRequest
      cancelReplaceRequest(queryOrigClOrdID(), queryClOrdID(), querySide(), FIX::TransactTime(), queryOrdType());

  cancelReplaceRequest.set(FIX::HandlInst('1'));
  cancelReplaceRequest.set(querySymbol());
  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}